

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

int PreLoopInitialize(VP8Encoder *enc)

{
  long in_RDI;
  int bytes_per_parts;
  int average_bytes_per_MB;
  int ok;
  int p;
  size_t in_stack_ffffffffffffffd8;
  uint7 in_stack_ffffffffffffffe0;
  bool bVar1;
  undefined4 local_10;
  undefined4 local_c;
  
  local_10 = 1;
  local_c = 0;
  while( true ) {
    bVar1 = false;
    if (local_10 != 0) {
      bVar1 = local_c < *(int *)(in_RDI + 0x3c);
    }
    if (bVar1 == false) break;
    local_10 = VP8BitWriterInit((VP8BitWriter *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffd8);
    local_c = local_c + 1;
  }
  if (local_10 == 0) {
    VP8EncFreeBitWriters((VP8Encoder *)(ulong)in_stack_ffffffffffffffe0);
    WebPEncodingSetError(*(WebPPicture **)(in_RDI + 8),VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return local_10;
}

Assistant:

static int PreLoopInitialize(VP8Encoder* const enc) {
  int p;
  int ok = 1;
  const int average_bytes_per_MB = kAverageBytesPerMB[enc->base_quant_ >> 4];
  const int bytes_per_parts =
      enc->mb_w_ * enc->mb_h_ * average_bytes_per_MB / enc->num_parts_;
  // Initialize the bit-writers
  for (p = 0; ok && p < enc->num_parts_; ++p) {
    ok = VP8BitWriterInit(enc->parts_ + p, bytes_per_parts);
  }
  if (!ok) {
    VP8EncFreeBitWriters(enc);  // malloc error occurred
    WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return ok;
}